

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O1

void __thiscall
OpenMPAffinityClause::generateDOT
          (OpenMPAffinityClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_t sVar8;
  ulong *puVar9;
  long *plVar10;
  size_type *psVar11;
  ulong uVar12;
  pointer ppcVar13;
  undefined8 uVar14;
  uint uVar15;
  uint uVar16;
  string __str_1;
  string node_id;
  string __str;
  string __str_4;
  string parameter_string;
  string indent;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string clause_kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  long lStack_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  ulong *local_180;
  long local_178;
  ulong local_170;
  long lStack_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  long lStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  char *local_f8;
  undefined8 local_f0;
  char local_e8;
  undefined7 uStack_e7;
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  OpenMPAffinityClause *local_58;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_f8 = &local_e8;
  local_f0 = 0;
  local_e8 = '\0';
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_58 = this;
  std::__cxx11::string::_M_construct((ulong)&local_118,(char)depth);
  uVar16 = -depth;
  if (0 < depth) {
    uVar16 = depth;
  }
  uVar15 = 1;
  if (9 < uVar16) {
    uVar12 = (ulong)uVar16;
    uVar4 = 4;
    do {
      uVar15 = uVar4;
      uVar5 = (uint)uVar12;
      if (uVar5 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_00144b31;
      }
      if (uVar5 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_00144b31;
      }
      if (uVar5 < 10000) goto LAB_00144b31;
      uVar12 = uVar12 / 10000;
      uVar4 = uVar15 + 4;
    } while (99999 < uVar5);
    uVar15 = uVar15 + 1;
  }
LAB_00144b31:
  local_1a0 = &local_190;
  std::__cxx11::string::_M_construct((ulong)&local_1a0,(char)uVar15 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)depth >> 0x1f) + (long)local_1a0),uVar15,uVar16);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x1a7ead);
  local_1c0 = &local_1b0;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_1b0 = *puVar9;
    lStack_1a8 = plVar6[3];
  }
  else {
    local_1b0 = *puVar9;
    local_1c0 = (ulong *)*plVar6;
  }
  local_1b8 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  local_160 = &local_150;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_150 = *puVar9;
    lStack_148 = plVar6[3];
  }
  else {
    local_150 = *puVar9;
    local_160 = (ulong *)*plVar6;
  }
  local_158 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar16 = -index;
  if (0 < index) {
    uVar16 = index;
  }
  uVar15 = 1;
  if (9 < uVar16) {
    uVar12 = (ulong)uVar16;
    uVar4 = 4;
    do {
      uVar15 = uVar4;
      uVar5 = (uint)uVar12;
      if (uVar5 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_00144c88;
      }
      if (uVar5 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_00144c88;
      }
      if (uVar5 < 10000) goto LAB_00144c88;
      uVar12 = uVar12 / 10000;
      uVar4 = uVar15 + 4;
    } while (99999 < uVar5);
    uVar15 = uVar15 + 1;
  }
LAB_00144c88:
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1e0,(char)uVar15 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1e0._M_dataplus._M_p + ((uint)index >> 0x1f),uVar15,uVar16);
  uVar12 = 0xf;
  if (local_160 != &local_150) {
    uVar12 = local_150;
  }
  paVar1 = &local_1e0.field_2;
  if (uVar12 < local_1e0._M_string_length + local_158) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      uVar14 = local_1e0.field_2._M_allocated_capacity;
    }
    if (local_1e0._M_string_length + local_158 <= (ulong)uVar14) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,(ulong)local_160);
      goto LAB_00144d34;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1e0._M_dataplus._M_p);
LAB_00144d34:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  psVar11 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_78.field_2._M_allocated_capacity = *psVar11;
    local_78.field_2._8_8_ = puVar7[3];
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar11;
    local_78._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_78._M_string_length = puVar7[1];
  *puVar7 = psVar11;
  puVar7[1] = 0;
  *(undefined1 *)psVar11 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  std::operator+(&local_1e0,&local_118,parent_node);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_190 = *plVar10;
    lStack_188 = plVar6[3];
    local_1a0 = &local_190;
  }
  else {
    local_190 = *plVar10;
    local_1a0 = (long *)*plVar6;
  }
  local_198 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1a0,(ulong)local_78._M_dataplus._M_p);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_1b0 = *puVar9;
    lStack_1a8 = plVar6[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *puVar9;
    local_1c0 = (ulong *)*plVar6;
  }
  local_1b8 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_150 = *puVar9;
    lStack_148 = plVar6[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *puVar9;
    local_160 = (ulong *)*plVar6;
  }
  local_158 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_160);
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = local_f8;
  iVar2 = (int)dot_file;
  if (local_f8 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
  }
  else {
    sVar8 = strlen(local_f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar3,sVar8);
  }
  std::__cxx11::string::append((char *)&local_118);
  local_158 = 0;
  local_150 = local_150 & 0xffffffffffffff00;
  local_160 = &local_150;
  if (local_58->modifier == OMPC_AFFINITY_MODIFIER_iterator) {
    std::__cxx11::string::_M_replace((ulong)&local_160,0,(char *)0x0,0x1a7e8b);
  }
  if (local_158 != 0) {
    local_1c0 = &local_1b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)&local_1c0);
    std::operator+(&local_140,&local_118,&local_78);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_170 = *puVar9;
      lStack_168 = plVar6[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *puVar9;
      local_180 = (ulong *)*plVar6;
    }
    local_178 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1c0);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1e0.field_2._M_allocated_capacity = *psVar11;
      local_1e0.field_2._8_8_ = plVar6[3];
      local_1e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1e0.field_2._M_allocated_capacity = *psVar11;
      local_1e0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1e0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_190 = *plVar10;
      lStack_188 = plVar6[3];
      local_1a0 = &local_190;
    }
    else {
      local_190 = *plVar10;
      local_1a0 = (long *)*plVar6;
    }
    local_198 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_1a0);
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    paVar1 = &local_140.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = local_f8;
    if (local_f8 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
    }
    else {
      sVar8 = strlen(local_f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar3,sVar8);
    }
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,local_118._M_dataplus._M_p,
               local_118._M_dataplus._M_p + local_118._M_string_length);
    std::__cxx11::string::append((char *)local_d8);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_d8,(ulong)local_1c0);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_88 = *plVar10;
      lStack_80 = plVar6[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar10;
      local_98 = (long *)*plVar6;
    }
    local_90 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
    local_b8 = &local_a8;
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_a8 = *plVar10;
      lStack_a0 = plVar6[3];
    }
    else {
      local_a8 = *plVar10;
      local_b8 = (long *)*plVar6;
    }
    local_b0 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_1c0);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_140.field_2._M_allocated_capacity = *psVar11;
      local_140.field_2._8_8_ = plVar6[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar11;
      local_140._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_140._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_170 = *puVar9;
      lStack_168 = plVar6[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *puVar9;
      local_180 = (ulong *)*plVar6;
    }
    local_178 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_160);
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    puVar9 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_1e0.field_2._M_allocated_capacity = *puVar9;
      local_1e0.field_2._8_8_ = puVar7[3];
    }
    else {
      local_1e0.field_2._M_allocated_capacity = *puVar9;
      local_1e0._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_1e0._M_string_length = puVar7[1];
    *puVar7 = puVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_190 = *plVar10;
      lStack_188 = plVar6[3];
      local_1a0 = &local_190;
    }
    else {
      local_190 = *plVar10;
      local_1a0 = (long *)*plVar6;
    }
    local_198 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_1a0);
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_d8[0] != local_c8) {
      operator_delete(local_d8[0],local_c8[0] + 1);
    }
    pcVar3 = local_f8;
    if (local_f8 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
    }
    else {
      sVar8 = strlen(local_f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar3,sVar8);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
  }
  local_1c0 = &local_1b0;
  local_1b8 = 0;
  local_1b0 = local_1b0 & 0xffffffffffffff00;
  ppcVar13 = (local_58->super_OpenMPClause).expressions.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar13 !=
      (local_58->super_OpenMPClause).expressions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar16 = 0;
    do {
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      std::__cxx11::string::append((char *)&local_1e0);
      uVar15 = 1;
      if (9 < uVar16) {
        uVar12 = (ulong)uVar16;
        uVar4 = 4;
        do {
          uVar15 = uVar4;
          uVar5 = (uint)uVar12;
          if (uVar5 < 100) {
            uVar15 = uVar15 - 2;
            goto LAB_001456a8;
          }
          if (uVar5 < 1000) {
            uVar15 = uVar15 - 1;
            goto LAB_001456a8;
          }
          if (uVar5 < 10000) goto LAB_001456a8;
          uVar12 = uVar12 / 10000;
          uVar4 = uVar15 + 4;
        } while (99999 < uVar5);
        uVar15 = uVar15 + 1;
      }
LAB_001456a8:
      local_180 = &local_170;
      std::__cxx11::string::_M_construct((ulong)&local_180,(char)uVar15);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_180,uVar15,uVar16);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        uVar14 = local_1e0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_178 + local_1e0._M_string_length) {
        uVar12 = 0xf;
        if (local_180 != &local_170) {
          uVar12 = local_170;
        }
        if (uVar12 < local_178 + local_1e0._M_string_length) goto LAB_00145716;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_180,0,(char *)0x0,(ulong)local_1e0._M_dataplus._M_p);
      }
      else {
LAB_00145716:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_180);
      }
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_190 = *plVar6;
        lStack_188 = puVar7[3];
        local_1a0 = &local_190;
      }
      else {
        local_190 = *plVar6;
        local_1a0 = (long *)*puVar7;
      }
      local_198 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)plVar6 = 0;
      std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_1a0);
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,local_190 + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_140,&local_118,&local_78);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar9) {
        local_170 = *puVar9;
        lStack_168 = plVar6[3];
        local_180 = &local_170;
      }
      else {
        local_170 = *puVar9;
        local_180 = (ulong *)*plVar6;
      }
      local_178 = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1c0);
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_1e0.field_2._M_allocated_capacity = *psVar11;
        local_1e0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_1e0.field_2._M_allocated_capacity = *psVar11;
        local_1e0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_1e0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_190 = *plVar6;
        lStack_188 = puVar7[3];
        local_1a0 = &local_190;
      }
      else {
        local_190 = *plVar6;
        local_1a0 = (long *)*puVar7;
      }
      local_198 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_1a0);
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,local_190 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = local_f8;
      if (local_f8 == (char *)0x0) {
        std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
      }
      else {
        sVar8 = strlen(local_f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar3,sVar8);
      }
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d8,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      std::__cxx11::string::append((char *)local_d8);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_d8,(ulong)local_1c0);
      local_98 = &local_88;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_88 = *plVar10;
        lStack_80 = plVar6[3];
      }
      else {
        local_88 = *plVar10;
        local_98 = (long *)*plVar6;
      }
      local_90 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_98);
      local_b8 = &local_a8;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_a8 = *plVar10;
        lStack_a0 = plVar6[3];
      }
      else {
        local_a8 = *plVar10;
        local_b8 = (long *)*plVar6;
      }
      local_b0 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_1c0);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_140.field_2._M_allocated_capacity = *psVar11;
        local_140.field_2._8_8_ = plVar6[3];
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar11;
        local_140._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_140._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar9) {
        local_170 = *puVar9;
        lStack_168 = plVar6[3];
        local_180 = &local_170;
      }
      else {
        local_170 = *puVar9;
        local_180 = (ulong *)*plVar6;
      }
      local_178 = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,*ppcVar13,&local_119);
      uVar12 = 0xf;
      if (local_180 != &local_170) {
        uVar12 = local_170;
      }
      if (uVar12 < (ulong)(local_48 + local_178)) {
        uVar12 = 0xf;
        if (local_50 != local_40) {
          uVar12 = local_40[0];
        }
        if (uVar12 < (ulong)(local_48 + local_178)) goto LAB_00145bf2;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_180);
      }
      else {
LAB_00145bf2:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_50);
      }
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      puVar9 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_1e0.field_2._M_allocated_capacity = *puVar9;
        local_1e0.field_2._8_8_ = puVar7[3];
      }
      else {
        local_1e0.field_2._M_allocated_capacity = *puVar9;
        local_1e0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_1e0._M_string_length = puVar7[1];
      *puVar7 = puVar9;
      puVar7[1] = 0;
      *(undefined1 *)puVar9 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e0);
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_190 = *plVar10;
        lStack_188 = plVar6[3];
        local_1a0 = &local_190;
      }
      else {
        local_190 = *plVar10;
        local_1a0 = (long *)*plVar6;
      }
      local_198 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_1a0);
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,local_190 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      pcVar3 = local_f8;
      if (local_f8 == (char *)0x0) {
        std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
      }
      else {
        sVar8 = strlen(local_f8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar3,sVar8);
      }
      uVar16 = uVar16 + 1;
      ppcVar13 = ppcVar13 + 1;
    } while (ppcVar13 !=
             (local_58->super_OpenMPClause).expressions.
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  return;
}

Assistant:

void OpenMPAffinityClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "affinity_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPAffinityClauseModifier modifier = this->getModifier();
    std::string parameter_string;
    switch (modifier) {
        case OMPC_AFFINITY_MODIFIER_iterator:
            parameter_string = "iterator";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_modifier";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
 std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };

}